

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enummanager.cpp
# Opt level: O0

Enum * __thiscall camp::detail::EnumManager::addClass(EnumManager *this,string *name,string *id)

{
  bool bVar1;
  EnumAlreadyCreated *__return_storage_ptr__;
  Enum *this_00;
  element_type *peVar2;
  bool local_169;
  undefined1 local_158 [8];
  EnumInfo info;
  shared_ptr<camp::Enum> newEnum;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [48];
  EnumAlreadyCreated local_98;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>
  local_50;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>
  local_48;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>_>
  local_40;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>_>
  local_38;
  ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::multi_index::detail::nth_layer<2,_camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>,_boost::mpl::v_item<camp::detail::EnumManager::Name,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *local_30;
  NameIndex *names;
  IdIndex *ids;
  string *id_local;
  string *name_local;
  EnumManager *this_local;
  
  ids = (IdIndex *)id;
  id_local = name;
  name_local = (string *)this;
  names = (NameIndex *)
          boost::multi_index::
          multi_index_container<camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>
          ::get<camp::detail::EnumManager::Id>(&this->m_enums);
  local_30 = &boost::multi_index::
              multi_index_container<camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>
              ::get<camp::detail::EnumManager::Name>(&this->m_enums)->super_type;
  local_38.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>
        *)boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<1,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Id,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<1,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Id,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)names,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ids);
  local_40.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>
        *)boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::multi_index::detail::nth_layer<1,_camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>,_boost::mpl::v_item<camp::detail::EnumManager::Id,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::end((ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::multi_index::detail::nth_layer<1,_camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>,_boost::mpl::v_item<camp::detail::EnumManager::Id,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                 *)names);
  bVar1 = boost::operators_impl::operator!=(&local_38,&local_40);
  local_169 = true;
  if (!bVar1) {
    local_48.node =
         (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>
          *)boost::multi_index::detail::
            ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Name,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
            ::find<std::__cxx11::string>
                      ((ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Name,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                        *)local_30,id_local);
    local_50.node =
         (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>
          *)boost::multi_index::detail::
            ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::multi_index::detail::nth_layer<2,_camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>,_boost::mpl::v_item<camp::detail::EnumManager::Name,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
            ::end(local_30);
    local_169 = boost::operators_impl::operator!=(&local_48,&local_50);
  }
  if (local_169 == false) {
    this_00 = (Enum *)operator_new(0x68);
    Enum::Enum(this_00,id_local);
    std::shared_ptr<camp::Enum>::shared_ptr<camp::Enum,void>
              ((shared_ptr<camp::Enum> *)
               &info.enumPtr.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               this_00);
    EnumInfo::EnumInfo((EnumInfo *)local_158);
    std::__cxx11::string::operator=((string *)local_158,(string *)ids);
    std::__cxx11::string::operator=((string *)&info.field_0x18,(string *)id_local);
    std::shared_ptr<camp::Enum>::operator=
              ((shared_ptr<camp::Enum> *)&info.field_0x38,
               (shared_ptr<camp::Enum> *)
               &info.enumPtr.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    boost::multi_index::detail::
    ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::multi_index::detail::nth_layer<1,_camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>,_boost::mpl::v_item<camp::detail::EnumManager::Id,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
    ::insert(&(this->m_enums).super_type.super_type,(value_type *)local_158);
    peVar2 = std::__shared_ptr_access<camp::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<camp::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &info.enumPtr.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    ObserverNotifier::notifyEnumAdded(&this->super_ObserverNotifier,peVar2);
    peVar2 = std::__shared_ptr_access<camp::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<camp::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &info.enumPtr.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    EnumInfo::~EnumInfo((EnumInfo *)local_158);
    std::shared_ptr<camp::Enum>::~shared_ptr
              ((shared_ptr<camp::Enum> *)
               &info.enumPtr.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    return peVar2;
  }
  newEnum.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1;
  __return_storage_ptr__ = (EnumAlreadyCreated *)__cxa_allocate_exception(0x48);
  EnumAlreadyCreated::EnumAlreadyCreated(&local_98,id_local,(string *)ids);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enummanager.cpp"
             ,&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f0,
             "Enum &camp::detail::EnumManager::addClass(const std::string &, const std::string &)",
             (allocator *)
             ((long)&newEnum.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  Error::prepare<camp::EnumAlreadyCreated>
            (__return_storage_ptr__,&local_98,(string *)local_c8,0x38,(string *)local_f0);
  newEnum.super___shared_ptr<camp::Enum,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
  __cxa_throw(__return_storage_ptr__,&EnumAlreadyCreated::typeinfo,
              EnumAlreadyCreated::~EnumAlreadyCreated);
}

Assistant:

Enum& EnumManager::addClass(const std::string& name, const std::string& id)
{
    const IdIndex&   ids   = m_enums.get<Id>();
    const NameIndex& names = m_enums.get<Name>();

    // First make sure that the enum doesn't already exist
    if ((ids.find(id) != ids.end()) || (names.find(name) != names.end()))
        CAMP_ERROR(EnumAlreadyCreated(name, id));

    // Create the new class
    std::shared_ptr<Enum> newEnum(new Enum(name));

    // Insert it into the table
    EnumInfo info;
    info.id = id;
    info.name = name;
    info.enumPtr = newEnum;
    m_enums.insert(info);

    // Notify observers
    notifyEnumAdded(*newEnum);

    return *newEnum;
}